

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox.cpp
# Opt level: O3

void QComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  QSize QVar3;
  QSize QVar4;
  QSize QVar5;
  QSize QVar6;
  QSize QVar7;
  QSize QVar8;
  QSize QVar9;
  QSize QVar10;
  QSize QVar11;
  QSize QVar12;
  QSize QVar13;
  QSize QVar14;
  QSize QVar15;
  QSize QVar16;
  QSize QVar17;
  QSize QVar18;
  QSize QVar19;
  QSize QVar20;
  QSize QVar21;
  QSize QVar22;
  QSize QVar23;
  QSize QVar24;
  byte bVar25;
  int iVar26;
  QSize QVar27;
  QSize *pQVar28;
  long in_FS_OFFSET;
  undefined4 local_4c;
  anon_union_24_3_e3d07ef4_for_data local_48;
  char *pcStack_30;
  long local_20;
  
  QVar24.ht.m_i = local_48._12_4_;
  QVar24.wd.m_i = local_48._8_4_;
  QVar23.ht.m_i = local_48._12_4_;
  QVar23.wd.m_i = local_48._8_4_;
  QVar22.ht.m_i = local_48._12_4_;
  QVar22.wd.m_i = local_48._8_4_;
  QVar21.ht.m_i = local_48._12_4_;
  QVar21.wd.m_i = local_48._8_4_;
  QVar20.ht.m_i = local_48._12_4_;
  QVar20.wd.m_i = local_48._8_4_;
  QVar19.ht.m_i = local_48._12_4_;
  QVar19.wd.m_i = local_48._8_4_;
  QVar18.ht.m_i = local_48._12_4_;
  QVar18.wd.m_i = local_48._8_4_;
  QVar17.ht.m_i = local_48._12_4_;
  QVar17.wd.m_i = local_48._8_4_;
  QVar16.ht.m_i = local_48._12_4_;
  QVar16.wd.m_i = local_48._8_4_;
  QVar15.ht.m_i = local_48._12_4_;
  QVar15.wd.m_i = local_48._8_4_;
  QVar14.ht.m_i = local_48._12_4_;
  QVar14.wd.m_i = local_48._8_4_;
  QVar13.ht.m_i = local_48._12_4_;
  QVar13.wd.m_i = local_48._8_4_;
  QVar12.ht.m_i = local_48._12_4_;
  QVar12.wd.m_i = local_48._8_4_;
  QVar11.ht.m_i = local_48._12_4_;
  QVar11.wd.m_i = local_48._8_4_;
  QVar10.ht.m_i = local_48._12_4_;
  QVar10.wd.m_i = local_48._8_4_;
  QVar9.ht.m_i = local_48._12_4_;
  QVar9.wd.m_i = local_48._8_4_;
  QVar5.ht.m_i = local_48._12_4_;
  QVar5.wd.m_i = local_48._8_4_;
  QVar4.ht.m_i = local_48._12_4_;
  QVar4.wd.m_i = local_48._8_4_;
  QVar3.ht.m_i = local_48._12_4_;
  QVar3.wd.m_i = local_48._8_4_;
  QVar27.ht.m_i = local_48._12_4_;
  QVar27.wd.m_i = local_48._8_4_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    local_48._8_8_ = QVar16;
    switch(_id) {
    case 0:
      local_48._8_8_ = *(QSize *)(_a + 1);
      iVar26 = 0;
      break;
    case 1:
      local_4c = *_a[1];
      local_48._8_8_ = &local_4c;
      iVar26 = 1;
      break;
    case 2:
      local_48._8_8_ = *(QSize *)(_a + 1);
      iVar26 = 2;
      break;
    case 3:
      local_4c = *_a[1];
      local_48._8_8_ = &local_4c;
      iVar26 = 3;
      break;
    case 4:
      local_48._8_8_ = *(QSize *)(_a + 1);
      iVar26 = 4;
      break;
    case 5:
      local_4c = *_a[1];
      local_48._8_8_ = &local_4c;
      iVar26 = 5;
      break;
    case 6:
      local_48._8_8_ = *(QSize *)(_a + 1);
      iVar26 = 6;
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        clear((QComboBox *)_o);
        return;
      }
      goto LAB_003dd794;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        clearEditText((QComboBox *)_o);
        return;
      }
      goto LAB_003dd794;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setEditText((QComboBox *)_o,(QString *)_a[1]);
        return;
      }
      goto LAB_003dd794;
    case 10:
      iVar26 = *_a[1];
LAB_003dd48c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setCurrentIndex((QComboBox *)_o,iVar26);
        return;
      }
      goto LAB_003dd794;
    case 0xb:
      pQVar28 = (QSize *)_a[1];
switchD_003dd09a_caseD_2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setCurrentText((QComboBox *)_o,(QString *)pQVar28);
        return;
      }
      goto LAB_003dd794;
    case 0xc:
      local_48._16_4_ = -0x55555556;
      local_48._20_4_ = -0x55555556;
      pcStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_4_ = -0x55555556;
      local_48._4_4_ = -0x55555556;
      local_48._8_4_ = -0x55555556;
      local_48._12_4_ = -0x55555556;
      inputMethodQuery((QVariant *)&local_48,(QComboBox *)_o,*_a[1],(QVariant *)_a[2]);
      if ((QVariant *)*_a != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_48);
      }
LAB_003dd60f:
      ::QVariant::~QVariant((QVariant *)&local_48);
    default:
      goto switchD_003dd03a_caseD_3;
    }
    local_48._4_4_ = 0;
    local_48._0_4_ = 0;
    QMetaObject::activate(_o,&staticMetaObject,iVar26,&local_48.shared);
    goto switchD_003dd03a_caseD_3;
  case ReadProperty:
    local_48._8_8_ = QVar15;
    if (0xf < (uint)_id) goto switchD_003dd03a_caseD_3;
    break;
  case WriteProperty:
    local_48._8_8_ = QVar13;
    if (0xf < (uint)_id) goto switchD_003dd03a_caseD_3;
    pQVar28 = (QSize *)*_a;
    local_48._8_8_ = QVar14;
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setEditable((QComboBox *)_o,SUB41((pQVar28->wd).m_i,0));
        return;
      }
      break;
    default:
      goto switchD_003dd03a_caseD_3;
    case 2:
      goto switchD_003dd09a_caseD_2;
    case 3:
      iVar26 = (pQVar28->wd).m_i;
      goto LAB_003dd48c;
    case 5:
      iVar26 = (pQVar28->wd).m_i;
      if (iVar26 < 0) {
        local_48._0_4_ = 2;
        local_48._4_4_ = 0;
        local_48._8_4_ = 0;
        local_48._12_4_ = 0;
        local_48._16_4_ = 0;
        local_48._20_4_ = 0;
        pcStack_30 = "default";
        QMessageLogger::warning
                  ((char *)local_48.data,
                   "QComboBox::setMaxVisibleItems: Invalid max visible items (%d) must be >= 0");
      }
      else {
        *(int *)(*(long *)(_o + 8) + 0x33c) = iVar26;
        local_48._8_8_ = QVar20;
      }
      goto switchD_003dd03a_caseD_3;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setMaxCount((QComboBox *)_o,(pQVar28->wd).m_i);
        return;
      }
      break;
    case 7:
      *(int *)(*(long *)(_o + 8) + 800) = (pQVar28->wd).m_i;
      local_48._8_8_ = QVar19;
      goto switchD_003dd03a_caseD_3;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setSizeAdjustPolicy((QComboBox *)_o,(pQVar28->wd).m_i);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setMinimumContentsLength((QComboBox *)_o,(pQVar28->wd).m_i);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setIconSize((QComboBox *)_o,pQVar28);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setPlaceholderText((QComboBox *)_o,(QString *)pQVar28);
        return;
      }
      break;
    case 0xc:
      *(byte *)(*(long *)(_o + 8) + 0x34c) =
           *(byte *)(*(long *)(_o + 8) + 0x34c) & 0xfd | (char)(pQVar28->wd).m_i * '\x02';
      local_48._8_8_ = QVar18;
      goto switchD_003dd03a_caseD_3;
    case 0xd:
      *(byte *)(*(long *)(_o + 8) + 0x34c) =
           *(byte *)(*(long *)(_o + 8) + 0x34c) & 0xfb | (char)(pQVar28->wd).m_i << 2;
      QWidget::update((QWidget *)_o);
      QVar24.ht.m_i = local_48._12_4_;
      QVar24.wd.m_i = local_48._8_4_;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QWidget::updateGeometry((QWidget *)_o);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setModelColumn((QComboBox *)_o,(pQVar28->wd).m_i);
        return;
      }
      break;
    case 0xf:
      iVar26 = (pQVar28->wd).m_i;
      local_48._8_8_ = QVar17;
      if (*(int *)(*(long *)(_o + 8) + 0x330) != iVar26) {
        *(int *)(*(long *)(_o + 8) + 0x330) = iVar26;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QWidget::update((QWidget *)_o);
          return;
        }
        break;
      }
      goto switchD_003dd03a_caseD_3;
    }
    goto LAB_003dd794;
  default:
    goto switchD_003dd03a_caseD_3;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == editTextChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
      local_48._8_8_ = QVar27;
    }
    else if (pcVar1 == activated && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
      local_48._8_8_ = QVar3;
    }
    else if (pcVar1 == textActivated && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
      local_48._8_8_ = QVar4;
    }
    else if (pcVar1 == highlighted && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
      local_48._8_8_ = QVar5;
    }
    else if (pcVar1 == textHighlighted && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
      local_48._8_8_ = QVar9;
    }
    else if (pcVar1 == currentIndexChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
      local_48._8_8_ = QVar10;
    }
    else {
      local_48._8_8_ = QVar11;
      if (pcVar1 == currentTextChanged && lVar2 == 0) {
        *(undefined4 *)*_a = 6;
        local_48._8_8_ = QVar12;
      }
    }
    goto switchD_003dd03a_caseD_3;
  }
  pQVar28 = (QSize *)*_a;
  switch(_id) {
  case 0:
    (((Private *)&pQVar28->wd)->data).data[0] = *(long *)(*(long *)(_o + 8) + 0x2a0) != 0;
    local_48._8_8_ = QVar24;
    goto switchD_003dd03a_caseD_3;
  case 1:
    iVar26 = count((QComboBox *)_o);
    break;
  case 2:
    currentText((QString *)&local_48,(QComboBox *)_o);
    QVar27 = *pQVar28;
    QVar6.ht.m_i = local_48._4_4_;
    QVar6.wd.m_i = local_48._0_4_;
    *pQVar28 = QVar6;
    local_48._0_4_ = QVar27.wd.m_i;
    local_48._4_4_ = QVar27.ht.m_i;
    QVar3 = pQVar28[1];
    QVar7.ht.m_i = local_48._12_4_;
    QVar7.wd.m_i = local_48._8_4_;
    pQVar28[1] = QVar7;
    QVar4 = pQVar28[2];
    QVar8.ht.m_i = local_48._20_4_;
    QVar8.wd.m_i = local_48._16_4_;
    pQVar28[2] = QVar8;
    local_48._16_4_ = QVar4.wd.m_i;
    local_48._20_4_ = QVar4.ht.m_i;
    local_48._8_8_ = QVar3;
    if (QVar27 != (QSize)0x0) {
      LOCK();
      *(int *)QVar27 = *(int *)QVar27 + -1;
      UNLOCK();
      if (*(int *)QVar27 == 0) {
        QArrayData::deallocate((QArrayData *)QVar27,2,0x10);
      }
    }
    goto switchD_003dd03a_caseD_3;
  case 3:
    iVar26 = QPersistentModelIndex::row();
    break;
  case 4:
    QPersistentModelIndex::data((int)&local_48);
    ::QVariant::operator=((QVariant *)pQVar28,(QVariant *)&local_48);
    goto LAB_003dd60f;
  case 5:
    iVar26 = *(int *)(*(long *)(_o + 8) + 0x33c);
    break;
  case 6:
    iVar26 = *(int *)(*(long *)(_o + 8) + 0x340);
    break;
  case 7:
    iVar26 = *(int *)(*(long *)(_o + 8) + 800);
    break;
  case 8:
    iVar26 = *(int *)(*(long *)(_o + 8) + 0x324);
    break;
  case 9:
    iVar26 = *(int *)(*(long *)(_o + 8) + 0x334);
    break;
  case 10:
    QVar27 = iconSize((QComboBox *)_o);
    *pQVar28 = QVar27;
    goto switchD_003dd03a_caseD_3;
  case 0xb:
    lVar2 = *(long *)(_o + 8);
    QVar27 = *(QSize *)(lVar2 + 0x2c8);
    QVar3 = *(QSize *)(lVar2 + 0x2d0);
    QVar4 = *(QSize *)(lVar2 + 0x2d8);
    if (QVar27 != (QSize)0x0) {
      LOCK();
      *(int *)QVar27 = *(int *)QVar27 + 1;
      UNLOCK();
    }
    QVar5 = *pQVar28;
    *pQVar28 = QVar27;
    pQVar28[1] = QVar3;
    pQVar28[2] = QVar4;
    local_48._8_8_ = QVar22;
    if (QVar5 != (QSize)0x0) {
      LOCK();
      *(int *)QVar5 = *(int *)QVar5 + -1;
      UNLOCK();
      local_48._8_8_ = QVar23;
      if (*(int *)QVar5 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QArrayData::deallocate((QArrayData *)QVar5,2,0x10);
          return;
        }
        goto LAB_003dd794;
      }
    }
    goto switchD_003dd03a_caseD_3;
  case 0xc:
    bVar25 = *(byte *)(*(long *)(_o + 8) + 0x34c) >> 1;
    goto LAB_003dd6e8;
  case 0xd:
    bVar25 = *(byte *)(*(long *)(_o + 8) + 0x34c) >> 2;
LAB_003dd6e8:
    (((Private *)&pQVar28->wd)->data).data[0] = bVar25 & 1;
    local_48._8_8_ = QVar21;
    goto switchD_003dd03a_caseD_3;
  case 0xe:
    iVar26 = *(int *)(*(long *)(_o + 8) + 0x344);
    break;
  case 0xf:
    iVar26 = *(int *)(*(long *)(_o + 8) + 0x330);
  }
  *(int *)&((Private *)&pQVar28->wd)->data = iVar26;
switchD_003dd03a_caseD_3:
  QVar24 = (QSize)local_48._8_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_003dd794:
  local_48._8_8_ = QVar24;
  __stack_chk_fail();
}

Assistant:

void QComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->textActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->textHighlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->clear(); break;
        case 8: _t->clearEditText(); break;
        case 9: _t->setEditText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->setCurrentText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::editTextChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textActivated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::highlighted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textHighlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::currentIndexChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::currentTextChanged, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEditable(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->currentText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 4: *reinterpret_cast<QVariant*>(_v) = _t->currentData(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxCount(); break;
        case 7: *reinterpret_cast<InsertPolicy*>(_v) = _t->insertPolicy(); break;
        case 8: *reinterpret_cast<SizeAdjustPolicy*>(_v) = _t->sizeAdjustPolicy(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->minimumContentsLength(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->duplicatesEnabled(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 14: *reinterpret_cast<int*>(_v) = _t->modelColumn(); break;
        case 15: *reinterpret_cast<LabelDrawingMode*>(_v) = _t->labelDrawingMode(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEditable(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setCurrentText(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxCount(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setInsertPolicy(*reinterpret_cast<InsertPolicy*>(_v)); break;
        case 8: _t->setSizeAdjustPolicy(*reinterpret_cast<SizeAdjustPolicy*>(_v)); break;
        case 9: _t->setMinimumContentsLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 11: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 12: _t->setDuplicatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 14: _t->setModelColumn(*reinterpret_cast<int*>(_v)); break;
        case 15: _t->setLabelDrawingMode(*reinterpret_cast<LabelDrawingMode*>(_v)); break;
        default: break;
        }
    }
}